

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int wiz_show_stats(void)

{
  nh_menuitem *pnVar1;
  long lVar2;
  long lVar3;
  monst **ppmVar4;
  long lVar5;
  monst *pmVar6;
  menulist menu;
  long total_obj_count;
  long total_obj_size;
  long total_mon_count;
  long total_mon_size;
  long local_248;
  long count;
  char buf [256];
  char buf_1 [256];
  
  total_obj_size = 0;
  total_obj_count = 0;
  total_mon_size = 0;
  total_mon_count = 0;
  init_menulist(&menu);
  if (menu.size <= menu.icount) {
    lVar2 = (long)menu.size;
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  menu.items[menu.icount].id = 0;
  menu.items[menu.icount].role = MI_TEXT;
  menu.items[menu.icount].accel = '\0';
  menu.items[menu.icount].group_accel = '\0';
  menu.items[menu.icount].selected = '\0';
  builtin_strncpy(menu.items[menu.icount].caption,"Current memory s",0x10);
  builtin_strncpy(menu.items[menu.icount].caption + 0xb,"ory statistics:",0x10);
  menu.icount = menu.icount + 1;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,(long)menu.size * 0x10c);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.items[lVar2].caption[0] = '\0';
  menu.icount = menu.icount + 1;
  sprintf(buf,"Objects, size %d",0x68);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.items[lVar2].caption[0] = '\0';
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  menu.items[menu.icount].id = 0;
  menu.items[menu.icount].role = MI_TEXT;
  menu.items[menu.icount].accel = '\0';
  menu.items[menu.icount].group_accel = '\0';
  menu.items[menu.icount].selected = '\0';
  builtin_strncpy(menu.items[menu.icount].caption,"                ",0x10);
  builtin_strncpy(menu.items[menu.icount].caption + 0x10,"   count  bytes",0x10);
  menu.icount = menu.icount + 1;
  obj_chain(&menu,"invent",invent,&total_obj_count,&total_obj_size);
  obj_chain(&menu,"level->objlist",level->objlist,&total_obj_count,&total_obj_size);
  obj_chain(&menu,"buried",level->buriedobjlist,&total_obj_count,&total_obj_size);
  obj_chain(&menu,"magic chest obj",magic_chest_objs,&total_obj_count,&total_obj_size);
  mon_invent_chain(&menu,"minvent",level->monlist,&total_obj_count,&total_obj_size);
  ppmVar4 = &migrating_mons;
  mon_invent_chain(&menu,"migrating minvent",migrating_mons,&total_obj_count,&total_obj_size);
  count = 0;
  local_248 = 0;
  count_obj(invent,&count,&local_248,'\0','\x01');
  count_obj(level->objlist,&count,&local_248,'\0','\x01');
  count_obj(level->buriedobjlist,&count,&local_248,'\0','\x01');
  count_obj(magic_chest_objs,&count,&local_248,'\0','\x01');
  pmVar6 = (monst *)&level->monlist;
  while (pmVar6 = pmVar6->nmon, pmVar6 != (monst *)0x0) {
    count_obj(pmVar6->minvent,&count,&local_248,'\0','\x01');
  }
  while (ppmVar4 = &((monst *)ppmVar4)->nmon->nmon, (monst *)ppmVar4 != (monst *)0x0) {
    count_obj(((monst *)ppmVar4)->minvent,&count,&local_248,'\0','\x01');
  }
  lVar3 = total_obj_count + count;
  lVar5 = total_obj_size + local_248;
  total_obj_count = lVar3;
  total_obj_size = lVar5;
  sprintf(buf_1,"%-18s %4ld  %6ld","contained");
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf_1);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  menu.items[menu.icount].id = 0;
  menu.items[menu.icount].role = MI_TEXT;
  menu.items[menu.icount].accel = '\0';
  menu.items[menu.icount].group_accel = '\0';
  menu.items[menu.icount].selected = '\0';
  builtin_strncpy(menu.items[menu.icount].caption,"----------------",0x10);
  builtin_strncpy(menu.items[menu.icount].caption + 0x10,"-- -----  ------",0x10);
  menu.items[menu.icount].caption[0x20] = '\0';
  menu.icount = menu.icount + 1;
  sprintf(buf,"%-18s %4ld  %6ld","Total",lVar3,lVar5);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.items[lVar2].caption[0] = '\0';
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.items[lVar2].caption[0] = '\0';
  menu.icount = menu.icount + 1;
  sprintf(buf,"Monsters, size %d",0x78);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].caption[0] = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.icount = menu.icount + 1;
  mon_chain(&menu,"level->monlist",level->monlist,&total_mon_count,&total_mon_size);
  mon_chain(&menu,"migrating",migrating_mons,&total_mon_count,&total_mon_size);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  menu.items[menu.icount].id = 0;
  menu.items[menu.icount].role = MI_TEXT;
  menu.items[menu.icount].accel = '\0';
  menu.items[menu.icount].group_accel = '\0';
  menu.items[menu.icount].selected = '\0';
  builtin_strncpy(menu.items[menu.icount].caption,"----------------",0x10);
  builtin_strncpy(menu.items[menu.icount].caption + 0x10,"-- -----  ------",0x10);
  menu.items[menu.icount].caption[0x20] = '\0';
  menu.icount = menu.icount + 1;
  sprintf(buf,"%-18s %4ld  %6ld","Total",total_mon_count);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
  display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
  free(menu.items);
  return 0;
}

Assistant:

static int wiz_show_stats(void)
{
	char buf[BUFSZ];
	struct menulist menu;
	long total_obj_size = 0, total_obj_count = 0;
	long total_mon_size = 0, total_mon_count = 0;

	init_menulist(&menu);
	add_menutext(&menu, "Current memory statistics:");
	add_menutext(&menu, "");
	sprintf(buf, "Objects, size %d", (int) sizeof(struct obj));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");
	add_menutext(&menu, count_str);

	obj_chain(&menu, "invent", invent, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "level->objlist", level->objlist, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "buried", level->buriedobjlist,
				&total_obj_count, &total_obj_size);
	obj_chain(&menu, "magic chest obj", magic_chest_objs,
				&total_obj_count, &total_obj_size);
	mon_invent_chain(&menu, "minvent", level->monlist,
				&total_obj_count,&total_obj_size);
	mon_invent_chain(&menu, "migrating minvent", migrating_mons,
				&total_obj_count, &total_obj_size);

	contained(&menu, "contained",
				&total_obj_count, &total_obj_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_obj_count, total_obj_size);
	add_menutext(&menu, buf);

	add_menutext(&menu, "");
	add_menutext(&menu, "");
	sprintf(buf, "Monsters, size %d", (int) sizeof(struct monst));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");

	mon_chain(&menu, "level->monlist", level->monlist,
				&total_mon_count, &total_mon_size);
	mon_chain(&menu, "migrating", migrating_mons,
				&total_mon_count, &total_mon_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_mon_count, total_mon_size);
	add_menutext(&menu, buf);

	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}